

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcTestRunner.cpp
# Opt level: O2

void glcts::getBaseOptions
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,string *mustpassDir,string *apiName,string *configName,string *screenRotation,
               int width,int height)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  int local_104;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  local_104 = width;
  std::__cxx11::string::string((string *)&local_80,(string *)mustpassDir);
  std::__cxx11::string::string((string *)&local_a0,(string *)apiName);
  std::__cxx11::string::string((string *)&local_c0,(string *)configName);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&bStack_148,"--deqp-caselist-file=",(allocator<char> *)&local_128);
  std::operator+(&local_40,&bStack_148,&local_80);
  std::operator+(&local_e0,&local_40,&local_a0);
  std::operator+(&local_100,&local_e0,"-");
  std::operator+(&local_128,&local_100,&local_c0);
  std::operator+(&local_60,&local_128,".txt");
  std::__cxx11::string::~string((string *)&local_128);
  std::__cxx11::string::~string((string *)&local_100);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&bStack_148);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(args,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_128,"--deqp-screen-rotation=",(allocator<char> *)&local_100);
  std::operator+(&bStack_148,&local_128,screenRotation);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)args,&bStack_148);
  std::__cxx11::string::~string((string *)&bStack_148);
  std::__cxx11::string::~string((string *)&local_128);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_128,"--deqp-surface-width=",(allocator<char> *)&local_e0);
  de::toString<int>(&local_100,&local_104);
  std::operator+(&bStack_148,&local_128,&local_100);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)args,&bStack_148);
  std::__cxx11::string::~string((string *)&bStack_148);
  std::__cxx11::string::~string((string *)&local_100);
  std::__cxx11::string::~string((string *)&local_128);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_128,"--deqp-surface-height=",(allocator<char> *)&local_e0);
  de::toString<int>(&local_100,&height);
  std::operator+(&bStack_148,&local_128,&local_100);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)args,&bStack_148);
  std::__cxx11::string::~string((string *)&bStack_148);
  std::__cxx11::string::~string((string *)&local_100);
  std::__cxx11::string::~string((string *)&local_128);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&bStack_148,"--deqp-watchdog=disable",(allocator<char> *)&local_128);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)args,&bStack_148);
  std::__cxx11::string::~string((string *)&bStack_148);
  return;
}

Assistant:

static void getBaseOptions(std::vector<std::string>& args, const string mustpassDir, const string apiName,
						   const string configName, const string screenRotation, int width, int height)
{
	args.push_back(getCaseListFileOption(mustpassDir, apiName, configName));
	args.push_back(string("--deqp-screen-rotation=") + screenRotation);
	args.push_back(string("--deqp-surface-width=") + de::toString(width));
	args.push_back(string("--deqp-surface-height=") + de::toString(height));
	args.push_back("--deqp-watchdog=disable");
}